

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pricing_session.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::PricingSession::PricingSession(PricingSession *this,UserInfo *user_info)

{
  _Rb_tree_header *p_Var1;
  PricingSubscriber *this_00;
  PixieProvider *this_01;
  allocator<char> local_59;
  __shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> local_58;
  string local_48;
  
  (this->super_Subscriber)._vptr_Subscriber = (_func_int **)&PTR_Subscribe_00208458;
  (this->super_Pricing)._vptr_Pricing = (_func_int **)&PTR_SetPriceUpdateEventCallback_002084c0;
  p_Var1 = &(this->subscriptions_)._M_t._M_impl.super__Rb_tree_header;
  (this->subscriptions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->subscriptions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->provider_status_update_callback_).
  super__Vector_base<std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->provider_status_update_callback_).
  super__Vector_base<std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->provider_status_update_callback_).
  super__Vector_base<std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->price_update_callback_).
  super__Vector_base<std::function<void_(std::shared_ptr<bidfx_public_api::PriceUpdateEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::PriceUpdateEvent>)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->price_update_callback_).
  super__Vector_base<std::function<void_(std::shared_ptr<bidfx_public_api::PriceUpdateEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::PriceUpdateEvent>)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->price_update_callback_).
  super__Vector_base<std::function<void_(std::shared_ptr<bidfx_public_api::PriceUpdateEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::PriceUpdateEvent>)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->subscription_status_callback_).
  super__Vector_base<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->subscription_status_callback_).
  super__Vector_base<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->subscription_status_callback_).
  super__Vector_base<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->subscriptions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->subscriptions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->subscriptions_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (Log == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"PricingSession",&local_59);
    tools::LoggerFactory::GetLogger((LoggerFactory *)&local_58,&local_48);
    std::__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> *)&Log,&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    std::__cxx11::string::~string((string *)&local_48);
  }
  this->user_info_ = user_info;
  this_00 = (PricingSubscriber *)operator_new(0x20);
  PricingSubscriber::PricingSubscriber(this_00,this,user_info);
  this->pricing_subscriber_ = this_00;
  this_01 = (PixieProvider *)operator_new(0x300);
  pixie::PixieProvider::PixieProvider(this_01,user_info);
  this->pixie_provider_ = (Provider *)this_01;
  LOCK();
  (this->running_)._M_base._M_i = false;
  UNLOCK();
  PrepareCallbacks(this);
  return;
}

Assistant:

PricingSession::PricingSession(UserInfo* user_info)
{
    if (Log == nullptr)
    {
        Log = LoggerFactory::GetLogger("PricingSession");
    }

    user_info_ = user_info;
    pricing_subscriber_ = new PricingSubscriber(this, user_info);
    pixie_provider_ = new PixieProvider(user_info);
    running_ = ATOMIC_VAR_INIT(false);
    PrepareCallbacks();
}